

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdFinalizeFundRawTx
              (void *handle,void *fund_handle,char *tx_hex,double effective_fee_rate,int64_t *tx_fee
              ,uint32_t *append_txout_count,char **output_tx_hex)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  char **ppcVar2;
  bool bVar3;
  reference pvVar4;
  char *pcVar5;
  int64_t iVar6;
  CfdException *pCVar7;
  CfdCapiFundTargetAmount *target;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  allocator local_222;
  ElementsTransactionApi api;
  UtxoFilter filter;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  string local_1d0;
  char **local_1b0;
  void *local_1a8;
  int64_t *local_1a0;
  uint32_t *local_198;
  Amount calc_fee;
  Amount tx_fee_value;
  CoinSelectionOption option_params;
  ConfidentialTransactionController ctxc;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxo_list;
  ConfidentialAssetId fee_asset;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  Amount utxo_fee_value;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&option_params,"FundRawTxData",(allocator *)&ctxc);
  cfd::capi::CheckBuffer(fund_handle,(string *)&option_params);
  std::__cxx11::string::~string((string *)&option_params);
  bVar3 = cfd::capi::IsEmptyString(tx_hex);
  if (bVar3) {
    option_params._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
         + 0x67;
    option_params.change_spend_size_ = 0xcc1;
    option_params.effective_fee_baserate_ = (uint64_t)anon_var_dwarf_83e51f;
    cfd::core::logger::warn<>((CfdSourceLocation *)&option_params,"tx_hex is null or empty.");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&option_params,"Failed to parameter. tx_hex is null or empty.",
               (allocator *)&ctxc);
    cfd::core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&option_params);
    __cxa_throw(pCVar7,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (output_tx_hex != (char **)0x0) {
    cfd::CoinSelectionOption::CoinSelectionOption(&option_params);
    cfd::CoinSelectionOption::SetEffectiveFeeBaserate(&option_params,effective_fee_rate);
    cfd::CoinSelectionOption::SetLongTermFeeBaserate
              (&option_params,*(double *)((long)fund_handle + 0x78));
    cfd::CoinSelectionOption::SetDustFeeRate(&option_params,*(double *)((long)fund_handle + 0x70));
    cfd::CoinSelectionOption::SetKnapsackMinimumChange
              (&option_params,*(int64_t *)((long)fund_handle + 0x80));
    cfd::CoinSelectionOption::SetBlindInfo
              (&option_params,*(int *)((long)fund_handle + 0x88),*(int *)((long)fund_handle + 0x8c))
    ;
    cfd::core::Amount::Amount(&utxo_fee_value);
    cfd::core::Amount::Amount(&tx_fee_value);
    cfd::core::Amount::Amount(&calc_fee);
    utxo_list.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    utxo_list.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    utxo_list.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (*(char *)((long)fund_handle + 0x35) == '\x01') {
      cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(&option_params);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ctxc,0x21,
                 (allocator_type *)&map_target_value);
      memcpy(ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController,
             (void *)((long)fund_handle + 0x14),
             (long)ctxc.super_AbstractTransactionController.tx_address_ -
             (long)ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController);
      cfd::core::ByteData::ByteData
                ((ByteData *)&map_target_value,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ctxc);
      cfd::core::ConfidentialAssetId::ConfidentialAssetId(&fee_asset,(ByteData *)&map_target_value);
      local_1b0 = output_tx_hex;
      local_1a0 = tx_fee;
      local_198 = append_txout_count;
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&map_target_value);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&ctxc);
      cfd::CoinSelectionOption::SetFeeAsset(&option_params,&fee_asset);
      map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &map_target_value._M_t._M_impl.super__Rb_tree_header._M_header;
      map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      map_target_value._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header;
      reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (*(undefined8 **)((long)fund_handle + 0x58))[1];
      map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_1a8 = fund_handle;
      reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (__args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    **(undefined8 **)((long)fund_handle + 0x58); __args != pbVar1;
          __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &__args[2]._M_string_length) {
        cfd::core::Amount::Amount((Amount *)&ctxc,(int64_t)__args[1]._M_dataplus._M_p);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,cfd::core::Amount>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
                    *)&map_target_value,__args,(Amount *)&ctxc);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&reserve_txout_address,__args,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &__args[1]._M_string_length);
      }
      std::__cxx11::string::string((string *)&local_1d0,tx_hex,&local_222);
      fund_handle = local_1a8;
      cfd::api::ElementsTransactionApi::FundRawTransaction
                (&ctxc,&api,&local_1d0,
                 *(vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> **)((long)local_1a8 + 0x38)
                 ,&map_target_value,
                 *(vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
                   **)((long)local_1a8 + 0x48),&reserve_txout_address,&fee_asset,
                 *(bool *)((long)local_1a8 + 0x68),effective_fee_rate,&tx_fee_value,&filter,
                 &option_params,
                 *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   **)((long)local_1a8 + 0x50),*(NetType_conflict *)((long)local_1a8 + 0x10),
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0,&calc_fee);
      append_txout_count = local_198;
      tx_fee = local_1a0;
      std::__cxx11::string::~string((string *)&local_1d0);
      cfd::AbstractTransactionController::GetHex_abi_cxx11_
                (&local_1d0,&ctxc.super_AbstractTransactionController);
      ppcVar2 = local_1b0;
      pcVar5 = cfd::capi::CreateString(&local_1d0);
      *ppcVar2 = pcVar5;
      std::__cxx11::string::~string((string *)&local_1d0);
      cfd::ConfidentialTransactionController::~ConfidentialTransactionController(&ctxc);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&reserve_txout_address._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
      ::~_Rb_tree(&map_target_value._M_t);
      cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&fee_asset);
    }
    else {
      cfd::CoinSelectionOption::InitializeTxSizeInfo(&option_params);
      pvVar4 = std::
               vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
               ::at(*(vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
                      **)((long)fund_handle + 0x58),0);
      cfd::core::Amount::Amount((Amount *)&reserve_txout_address,pvVar4->amount);
      std::__cxx11::string::string((string *)&map_target_value,tx_hex,(allocator *)&local_1d0);
      cfd::api::TransactionApi::FundRawTransaction
                ((TransactionController *)&ctxc,(TransactionApi *)&fee_asset,
                 (string *)&map_target_value,
                 *(vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> **)
                  ((long)fund_handle + 0x38),(Amount *)&reserve_txout_address,
                 *(vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> **)
                  ((long)fund_handle + 0x40),&pvVar4->reserved_address,effective_fee_rate,
                 &tx_fee_value,&filter,&option_params,
                 *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   **)((long)fund_handle + 0x50),*(NetType_conflict *)((long)fund_handle + 0x10),
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0,&calc_fee);
      std::__cxx11::string::~string((string *)&map_target_value);
      cfd::AbstractTransactionController::GetHex_abi_cxx11_
                ((string *)&map_target_value,&ctxc.super_AbstractTransactionController);
      pcVar5 = cfd::capi::CreateString((string *)&map_target_value);
      *output_tx_hex = pcVar5;
      std::__cxx11::string::~string((string *)&map_target_value);
      cfd::TransactionController::~TransactionController((TransactionController *)&ctxc);
    }
    iVar6 = cfd::core::Amount::GetSatoshiValue(&calc_fee);
    *(int64_t *)((long)fund_handle + 0x60) = iVar6;
    if (tx_fee != (int64_t *)0x0) {
      iVar6 = cfd::core::Amount::GetSatoshiValue(&tx_fee_value);
      *tx_fee = iVar6;
    }
    if (append_txout_count != (uint32_t *)0x0) {
      *append_txout_count =
           (uint32_t)
           ((ulong)((*(long **)((long)fund_handle + 0x50))[1] -
                   **(long **)((long)fund_handle + 0x50)) >> 5);
    }
    std::_Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~_Vector_base
              (&utxo_list.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>);
    cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&option_params.fee_asset_);
    return 0;
  }
  option_params._0_8_ =
       (long)
       "//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
       + 0x67;
  option_params.change_spend_size_ = 0xcc7;
  option_params.effective_fee_baserate_ = (uint64_t)anon_var_dwarf_83e51f;
  cfd::core::logger::warn<>((CfdSourceLocation *)&option_params,"output_tx_hex is null.");
  pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&option_params,"Failed to parameter. output_tx_hex is null.",
             (allocator *)&ctxc);
  cfd::core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&option_params);
  __cxa_throw(pCVar7,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdFinalizeFundRawTx(
    void* handle, void* fund_handle, const char* tx_hex,
    double effective_fee_rate, int64_t* tx_fee, uint32_t* append_txout_count,
    char** output_tx_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
#ifndef CFD_DISABLE_ELEMENTS
  auto convert_to_asset = [](const uint8_t* asset) -> ConfidentialAssetId {
    std::vector<uint8_t> bytes(33);
    memcpy(bytes.data(), asset, bytes.size());
    return ConfidentialAssetId(ByteData(bytes));
  };
#endif  // CFD_DISABLE_ELEMENTS

  try {
    cfd::Initialize();
    CheckBuffer(fund_handle, kPrefixFundRawTxData);
    if (IsEmptyString(tx_hex)) {
      warn(CFD_LOG_SOURCE, "tx_hex is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx_hex is null or empty.");
    }
    if (output_tx_hex == nullptr) {
      warn(CFD_LOG_SOURCE, "output_tx_hex is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output_tx_hex is null.");
    }
    CfdCapiFundRawTxData* buffer =
        static_cast<CfdCapiFundRawTxData*>(fund_handle);

    CoinSelectionOption option_params;
    option_params.SetEffectiveFeeBaserate(effective_fee_rate);
    option_params.SetLongTermFeeBaserate(buffer->long_term_fee_rate);
    option_params.SetDustFeeRate(buffer->dust_fee_rate);
    option_params.SetKnapsackMinimumChange(buffer->knapsack_min_change);
#ifndef CFD_DISABLE_ELEMENTS
    option_params.SetBlindInfo(buffer->exponent, buffer->minimum_bits);
#endif  // CFD_DISABLE_ELEMENTS

    Amount utxo_fee_value;
    UtxoFilter filter;
    Amount tx_fee_value;
    Amount calc_fee;
    std::vector<Utxo> utxo_list;
    if (buffer->is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
      // elements
      option_params.InitializeConfidentialTxSizeInfo();
      ConfidentialAssetId fee_asset = convert_to_asset(buffer->fee_asset);
      option_params.SetFeeAsset(fee_asset);

      std::map<std::string, Amount> map_target_value;
      std::map<std::string, std::string> reserve_txout_address;
      for (const auto& target : *(buffer->targets)) {
        map_target_value.emplace(target.asset, Amount(target.amount));
        reserve_txout_address.emplace(target.asset, target.reserved_address);
      }

      ElementsTransactionApi api;
      ConfidentialTransactionController ctxc = api.FundRawTransaction(
          tx_hex, *buffer->utxos, map_target_value,
          *buffer->input_elements_utxos, reserve_txout_address, fee_asset,
          buffer->is_blind, effective_fee_rate, &tx_fee_value, &filter,
          &option_params, buffer->append_txout_addresses, buffer->net_type,
          nullptr, &calc_fee);
      if (output_tx_hex != nullptr) {
        *output_tx_hex = CreateString(ctxc.GetHex());
      }
#endif  // CFD_DISABLE_ELEMENTS
    } else {
      // bitcoin
      option_params.InitializeTxSizeInfo();
      auto& target = buffer->targets->at(0);
      Amount target_value(target.amount);

      TransactionApi api;
      TransactionController txc = api.FundRawTransaction(
          tx_hex, *buffer->utxos, target_value, *buffer->input_utxos,
          target.reserved_address, effective_fee_rate, &tx_fee_value, &filter,
          &option_params, buffer->append_txout_addresses, buffer->net_type,
          nullptr, &calc_fee);
      if (output_tx_hex != nullptr) {
        *output_tx_hex = CreateString(txc.GetHex());
      }
    }

    buffer->calculate_fee = calc_fee.GetSatoshiValue();
    if (tx_fee != nullptr) {
      *tx_fee = tx_fee_value.GetSatoshiValue();
    }
    if (append_txout_count != nullptr) {
      *append_txout_count =
          static_cast<uint32_t>(buffer->append_txout_addresses->size());
    }

    result = CfdErrorCode::kCfdSuccess;
    return result;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}